

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryCache.cpp
# Opt level: O2

void BinaryCache::RemoveBytecode(char *path)

{
  char *pcVar1;
  Lexeme *pLVar2;
  undefined4 uVar3;
  undefined *puVar4;
  uint uVar5;
  CodeDescriptor *pCVar6;
  CodeDescriptor *pCVar7;
  uint index;
  
  uVar5 = NULLC::GetStringHash(path);
  index = 0;
  while ((index < DAT_0022727c &&
         (pCVar6 = FastVector<BinaryCache::CodeDescriptor,_false,_false>::operator[]
                             ((FastVector<BinaryCache::CodeDescriptor,_false,_false> *)&cache,index)
         , uVar5 != pCVar6->nameHash))) {
    index = index + 1;
  }
  puVar4 = NULLC::dealloc;
  if (DAT_0022727c != index) {
    pCVar6 = FastVector<BinaryCache::CodeDescriptor,_false,_false>::operator[]
                       ((FastVector<BinaryCache::CodeDescriptor,_false,_false> *)&cache,index);
    (*(code *)puVar4)(pCVar6->name);
    pCVar6 = FastVector<BinaryCache::CodeDescriptor,_false,_false>::operator[]
                       ((FastVector<BinaryCache::CodeDescriptor,_false,_false> *)&cache,index);
    if (pCVar6->binary != (char *)0x0) {
      operator_delete__(pCVar6->binary);
    }
    pCVar6 = FastVector<BinaryCache::CodeDescriptor,_false,_false>::operator[]
                       ((FastVector<BinaryCache::CodeDescriptor,_false,_false> *)&cache,index);
    if (pCVar6->lexemes != (Lexeme *)0x0) {
      operator_delete__(pCVar6->lexemes);
    }
    pCVar6 = FastVector<BinaryCache::CodeDescriptor,_false,_false>::back
                       ((FastVector<BinaryCache::CodeDescriptor,_false,_false> *)&cache);
    pCVar7 = FastVector<BinaryCache::CodeDescriptor,_false,_false>::operator[]
                       ((FastVector<BinaryCache::CodeDescriptor,_false,_false> *)&cache,index);
    uVar5 = pCVar6->nameHash;
    uVar3 = *(undefined4 *)&pCVar6->field_0xc;
    pcVar1 = pCVar6->binary;
    pLVar2 = pCVar6->lexemes;
    pCVar7->name = pCVar6->name;
    pCVar7->nameHash = uVar5;
    *(undefined4 *)&pCVar7->field_0xc = uVar3;
    pCVar7->binary = pcVar1;
    pCVar7->lexemes = pLVar2;
    uVar3 = *(undefined4 *)&pCVar6->field_0x24;
    pCVar7->lexemeCount = pCVar6->lexemeCount;
    *(undefined4 *)&pCVar7->field_0x24 = uVar3;
    FastVector<BinaryCache::CodeDescriptor,_false,_false>::pop_back
              ((FastVector<BinaryCache::CodeDescriptor,_false,_false> *)&cache);
    return;
  }
  return;
}

Assistant:

void BinaryCache::RemoveBytecode(const char* path)
{
	unsigned int hash = NULLC::GetStringHash(path);
	unsigned int i = 0;
	for(; i < cache.size(); i++)
	{
		if(hash == cache[i].nameHash)
			break;
	}
	if(i == cache.size())
		return;

	NULLC::dealloc((void*)cache[i].name);
	delete[] cache[i].binary;
	delete[] cache[i].lexemes;

	cache[i] = cache.back();
	cache.pop_back();
}